

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.cc
# Opt level: O3

void __thiscall absl::lts_20250127::substitute_internal::Arg::Arg(Arg *this,Dec dec)

{
  Arg *pAVar1;
  bool bVar2;
  char __tmp;
  ulong uVar3;
  size_t __n;
  byte bVar4;
  ulong uVar5;
  Arg *pAVar6;
  char *__s;
  
  uVar3 = dec.value;
  (this->piece_)._M_len = 0;
  (this->piece_)._M_str = (char *)0x0;
  if (0x20 < dec.width) {
    __assert_fail("dec.width <= numbers_internal::kFastToBufferSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/substitute.cc"
                  ,0x9a,"absl::substitute_internal::Arg::Arg(Dec)");
  }
  pAVar1 = this + 1;
  uVar5 = uVar3;
  pAVar6 = pAVar1;
  if (9 < uVar3) {
    do {
      uVar3 = uVar5 / 10;
      pAVar6[-1].scratch_[0x1f] = (char)uVar5 + (char)uVar3 * -10 | 0x30;
      pAVar6 = (Arg *)(pAVar6[-1].scratch_ + 0x1f);
      bVar2 = 99 < uVar5;
      uVar5 = uVar3;
    } while (bVar2);
  }
  pAVar6[-1].scratch_[0x1f] = (byte)uVar3 | 0x30;
  if ((dec._8_4_ >> 0x10 & 1) == 0) {
    __s = pAVar6[-1].scratch_ + 0x1f;
  }
  else {
    pAVar6[-1].scratch_[0x1e] = '-';
    __s = pAVar6[-1].scratch_ + 0x1e;
  }
  __n = (long)__s - ((long)pAVar1 - (ulong)(dec._8_4_ & 0x3f));
  if (0 < (long)__n) {
    bVar4 = dec.fill == '0' & dec.neg;
    __s = __s + (bVar4 - __n);
    memset(__s,dec._9_4_ & 0xff,__n);
    if (bVar4 == 1) {
      __s[-1] = '-';
      __s = __s + -1;
    }
  }
  (this->piece_)._M_len = (long)pAVar1 - (long)__s;
  (this->piece_)._M_str = __s;
  return;
}

Assistant:

Arg::Arg(Dec dec) {
  assert(dec.width <= numbers_internal::kFastToBufferSize);
  char* const end = &scratch_[numbers_internal::kFastToBufferSize];
  char* const minfill = end - dec.width;
  char* writer = end;
  uint64_t value = dec.value;
  bool neg = dec.neg;
  while (value > 9) {
    *--writer = '0' + (value % 10);
    value /= 10;
  }
  *--writer = '0' + static_cast<char>(value);
  if (neg) *--writer = '-';

  ptrdiff_t fillers = writer - minfill;
  if (fillers > 0) {
    // Tricky: if the fill character is ' ', then it's <fill><+/-><digits>
    // But...: if the fill character is '0', then it's <+/-><fill><digits>
    bool add_sign_again = false;
    if (neg && dec.fill == '0') {  // If filling with '0',
      ++writer;                    // ignore the sign we just added
      add_sign_again = true;       // and re-add the sign later.
    }
    writer -= fillers;
    std::fill_n(writer, fillers, dec.fill);
    if (add_sign_again) *--writer = '-';
  }

  piece_ = absl::string_view(writer, static_cast<size_t>(end - writer));
}